

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push.cpp
# Opt level: O0

void __thiscall
zmq::push_t::xattach_pipe(push_t *this,pipe_t *pipe_,bool subscribe_to_all_,bool locally_initiated_)

{
  pipe_t *in_RSI;
  lb_t *in_RDI;
  pipe_t *in_stack_ffffffffffffffd8;
  
  pipe_t::set_nodelay(in_RSI);
  if (in_RSI == (pipe_t *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","pipe_",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/push.cpp"
            ,0x3a);
    fflush(_stderr);
    zmq_abort((char *)0x2fe0db);
  }
  lb_t::attach(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void zmq::push_t::xattach_pipe (pipe_t *pipe_,
                                bool subscribe_to_all_,
                                bool locally_initiated_)
{
    LIBZMQ_UNUSED (subscribe_to_all_);
    LIBZMQ_UNUSED (locally_initiated_);

    //  Don't delay pipe termination as there is no one
    //  to receive the delimiter.
    pipe_->set_nodelay ();

    zmq_assert (pipe_);
    _lb.attach (pipe_);
}